

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

bool QPDF::test_json_validators(void)

{
  bool bVar1;
  anon_class_8_1_65cfa1ae check_fn;
  int gen;
  int obj;
  bool passed;
  string str;
  allocator<char> local_61;
  anon_class_8_1_65cfa1ae local_60;
  int local_58;
  int local_54;
  string local_50;
  bool local_29;
  string local_28;
  
  local_60.passed = &local_29;
  local_29 = true;
  local_54 = 0;
  local_58 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_indirect_object(\"\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"12",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_indirect_object(\"12\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"x12 0 R",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_indirect_object(\"x12 0 R\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"12 0 Rx",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_indirect_object(\"12 0 Rx\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"12 0R",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_indirect_object(\"12 0R\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"52 1 R",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_indirect_object(\"52 1 R\", obj, gen)",bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"obj == 52",local_54 == 0x34);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"gen == 1",local_58 == 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"53  20  R",(allocator<char> *)&local_50);
  bVar1 = is_indirect_object(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_indirect_object(\"53  20  R\", obj, gen)",bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"obj == 53",local_54 == 0x35);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"gen == 20",local_58 == 0x14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"",(allocator<char> *)&local_50);
  bVar1 = is_obj_key(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_obj_key(\"\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"obj:x",(allocator<char> *)&local_50);
  bVar1 = is_obj_key(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_obj_key(\"obj:x\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"obj:x",(allocator<char> *)&local_50);
  bVar1 = is_obj_key(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_obj_key(\"obj:x\", obj, gen)",!bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"obj:12 13 R",(allocator<char> *)&local_50);
  bVar1 = is_obj_key(&local_28,&local_54,&local_58);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_obj_key(\"obj:12 13 R\", obj, gen)",bVar1);
  std::__cxx11::string::~string((string *)&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"obj == 12",local_54 == 0xc);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"gen == 13",local_58 == 0xd);
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_61);
  bVar1 = is_unicode_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_unicode_string(\"\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"xyz",&local_61);
  bVar1 = is_unicode_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_unicode_string(\"xyz\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x:",&local_61);
  bVar1 = is_unicode_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_unicode_string(\"x:\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u:potato",&local_61);
  bVar1 = is_unicode_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_unicode_string(\"u:potato\", str)",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::operator==(&local_28,"potato");
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"str == \"potato\"",bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u:",&local_61);
  bVar1 = is_unicode_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_unicode_string(\"u:\", str)",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::operator==(&local_28,"");
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"str == \"\"",bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_binary_string(\"\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x:",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_binary_string(\"x:\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:1",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_binary_string(\"b:1\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:123",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_binary_string(\"b:123\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:gh",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"!is_binary_string(\"b:gh\", str)",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_binary_string(\"b:\", str)",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:12",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_binary_string(\"b:12\", str)",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"b:123aBC",&local_61);
  bVar1 = is_binary_string(&local_50,&local_28);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_binary_string(\"b:123aBC\", str)",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_61);
  bVar1 = is_name(&local_50);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"!is_name(\"\")",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/",&local_61);
  bVar1 = is_name(&local_50);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"!is_name(\"/\")",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"xyz",&local_61);
  bVar1 = is_name(&local_50);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"!is_name(\"xyz\")",!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Potato",&local_61);
  bVar1 = is_name(&local_50);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()(&local_60,"is_name(\"/Potato\")",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Potato Salad",&local_61);
  bVar1 = is_name(&local_50);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            (&local_60,"is_name(\"/Potato Salad\")",bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = local_29;
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool
QPDF::test_json_validators()
{
    bool passed = true;
    auto check_fn = [&passed](char const* msg, bool expr) {
        if (!expr) {
            passed = false;
            std::cerr << msg << std::endl;
        }
    };
#define check(expr) check_fn(#expr, expr)

    int obj = 0;
    int gen = 0;
    check(!is_indirect_object("", obj, gen));
    check(!is_indirect_object("12", obj, gen));
    check(!is_indirect_object("x12 0 R", obj, gen));
    check(!is_indirect_object("12 0 Rx", obj, gen));
    check(!is_indirect_object("12 0R", obj, gen));
    check(is_indirect_object("52 1 R", obj, gen));
    check(obj == 52);
    check(gen == 1);
    check(is_indirect_object("53  20  R", obj, gen));
    check(obj == 53);
    check(gen == 20);
    check(!is_obj_key("", obj, gen));
    check(!is_obj_key("obj:x", obj, gen));
    check(!is_obj_key("obj:x", obj, gen));
    check(is_obj_key("obj:12 13 R", obj, gen));
    check(obj == 12);
    check(gen == 13);
    std::string str;
    check(!is_unicode_string("", str));
    check(!is_unicode_string("xyz", str));
    check(!is_unicode_string("x:", str));
    check(is_unicode_string("u:potato", str));
    check(str == "potato");
    check(is_unicode_string("u:", str));
    check(str == "");
    check(!is_binary_string("", str));
    check(!is_binary_string("x:", str));
    check(!is_binary_string("b:1", str));
    check(!is_binary_string("b:123", str));
    check(!is_binary_string("b:gh", str));
    check(is_binary_string("b:", str));
    check(is_binary_string("b:12", str));
    check(is_binary_string("b:123aBC", str));
    check(!is_name(""));
    check(!is_name("/"));
    check(!is_name("xyz"));
    check(is_name("/Potato"));
    check(is_name("/Potato Salad"));

    return passed;
#undef check_arg
}